

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O0

void readfile(char *data_file)

{
  undefined1 auVar1 [16];
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  int *piVar4;
  reference pvVar5;
  value_type_conflict1 vStack_30df8;
  value_type_conflict1 vStack_30df0;
  int iStack_30de4;
  int iStack_30de0;
  int j_1;
  int i_3;
  int i_2;
  int iStack_30dcc;
  int iStack_30dc8;
  int j;
  int i_1;
  int min_c;
  int *label;
  pointer pdStack_30db0;
  pointer pdStack_30da8;
  vector<double,_std::allocator<double>_> vStack_30d88;
  int iStack_30d64;
  char *pcStack_30d60;
  int i;
  char *tmp;
  char buff [200000];
  FILE *f;
  char *data_file_local;
  
  __stream = fopen(data_file,"r");
  for (iStack_30d64 = 0; iStack_30d64 < data_n; iStack_30d64 = iStack_30d64 + 1) {
    vStack_30d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    vStack_30d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    vStack_30d88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector(&vStack_30d88);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&data_x,&vStack_30d88);
    std::vector<double,_std::allocator<double>_>::~vector(&vStack_30d88);
    label = (int *)0x0;
    pdStack_30db0 = (pointer)0x0;
    pdStack_30da8 = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&label);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&data_y,(vector<double,_std::allocator<double>_> *)&label);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&label);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)data_n;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  _i_1 = operator_new__(uVar3);
  j = 200000;
  for (iStack_30dc8 = 0; iStack_30dc8 < data_n; iStack_30dc8 = iStack_30dc8 + 1) {
    fgets((char *)&tmp,200000,__stream);
    pcStack_30d60 = strtok((char *)&tmp,", \r\n");
    iVar2 = atoi(pcStack_30d60);
    *(int *)((long)_i_1 + (long)iStack_30dc8 * 4) = iVar2;
    piVar4 = std::min<int>(&j,(int *)((long)_i_1 + (long)iStack_30dc8 * 4));
    j = *piVar4;
    pcStack_30d60 = strtok((char *)0x0,", \r\n");
    for (iStack_30dcc = 0; iStack_30dcc < ts_len; iStack_30dcc = iStack_30dcc + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&data_x,(long)iStack_30dc8);
      _i_3 = atof(pcStack_30d60);
      std::vector<double,_std::allocator<double>_>::push_back(pvVar5,(value_type_conflict1 *)&i_3);
      pcStack_30d60 = strtok((char *)0x0,", \r\n");
    }
  }
  num_c = 0;
  for (j_1 = 0; j_1 < data_n; j_1 = j_1 + 1) {
    *(int *)((long)_i_1 + (long)j_1 * 4) = *(int *)((long)_i_1 + (long)j_1 * 4) - j;
    piVar4 = std::max<int>(&num_c,(int *)((long)_i_1 + (long)j_1 * 4));
    num_c = *piVar4;
  }
  num_c = num_c + 1;
  for (iStack_30de0 = 0; iStack_30de0 < data_n; iStack_30de0 = iStack_30de0 + 1) {
    for (iStack_30de4 = 0; iStack_30de4 < num_c; iStack_30de4 = iStack_30de4 + 1) {
      if (iStack_30de4 == *(int *)((long)_i_1 + (long)iStack_30de0 * 4)) {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&data_y,(long)iStack_30de0);
        vStack_30df0 = 1.0;
        std::vector<double,_std::allocator<double>_>::push_back(pvVar5,&vStack_30df0);
      }
      else {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&data_y,(long)iStack_30de0);
        vStack_30df8 = 0.0;
        std::vector<double,_std::allocator<double>_>::push_back(pvVar5,&vStack_30df8);
      }
    }
  }
  if (_i_1 != (void *)0x0) {
    operator_delete__(_i_1);
  }
  fclose(__stream);
  return;
}

Assistant:

void readfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < data_n; ++i) {
        data_x.push_back(vector<double>());
        data_y.push_back(vector<double>());
    }

    int *label = new int[data_n];
    int min_c = MAX_CHAR_PER_LINE;

    for (int i = 0; i < data_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        label[i] = atoi(tmp);
        min_c = min(min_c, label[i]);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {
            data_x[i].push_back(atof(tmp));
            tmp = strtok(NULL, ", \r\n");
        }
    }

    num_c = 0;
    for (int i = 0; i < data_n; ++i) {
        label[i] -= min_c;
        num_c = max(num_c, label[i]);
    }
    ++num_c;

    /**
     * label(xi) = a => y = {0 .... 1 .... 0}
     *                              ^
     *                              a position
     */
    for (int i = 0; i < data_n; ++i) {
        for (int j = 0; j < num_c; ++j) {
            if (j == label[i]) {
                data_y[i].push_back(1.0);
            } else {
                data_y[i].push_back(0.0);
            }
        }
    }

    delete[] label;

    fclose(f);
}